

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

Id __thiscall
spv::Builder::accessChainLoad
          (Builder *this,Decoration precision,Decoration l_nonUniform,Decoration r_nonUniform,
          Id resultType,MemoryAccessMask memoryAccess,Scope scope,uint alignment)

{
  uint uVar1;
  pointer ppIVar2;
  pointer puVar3;
  pointer puVar4;
  bool bVar5;
  StorageClass SVar6;
  Id IVar7;
  Id IVar8;
  Id *pIVar9;
  Id *pIVar10;
  Instruction *pIVar11;
  ulong uVar12;
  int i;
  MemoryAccessMask memoryAccess_00;
  long lVar13;
  uint local_4c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  
  if ((this->accessChain).isRValue == true) {
    transferAccessChainSwizzle(this,false);
    pIVar9 = (this->accessChain).indexChain.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pIVar10 = (this->accessChain).indexChain.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (pIVar10 == pIVar9) {
      IVar7 = (this->accessChain).base;
    }
    else {
      IVar7 = (this->accessChain).preSwizzleBaseType;
      if (IVar7 == 0) {
        IVar7 = resultType;
      }
      indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      for (lVar13 = 0; lVar13 < (int)((ulong)((long)pIVar10 - (long)pIVar9) >> 2);
          lVar13 = lVar13 + 1) {
        ppIVar2 = (this->module).idToInstruction.
                  super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (ppIVar2[pIVar9[lVar13]]->opCode != OpConstant) {
          uVar1 = (this->accessChain).base;
          pIVar11 = ppIVar2[uVar1];
          if (pIVar11 == (Instruction *)0x0) {
            uVar12 = 0;
          }
          else {
            uVar12 = (ulong)pIVar11->typeId;
          }
          if (ppIVar2[uVar12]->opCode == OpTypeCooperativeVectorNV) {
            if ((long)pIVar10 - (long)pIVar9 != 4) {
              __assert_fail("accessChain.indexChain.size() == 1",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                            ,0xfde,
                            "Id spv::Builder::accessChainLoad(Decoration, Decoration, Decoration, Id, spv::MemoryAccessMask, spv::Scope, unsigned int)"
                           );
            }
            IVar7 = createVectorExtractDynamic(this,uVar1,resultType,*pIVar9);
          }
          else {
            if (this->spvVersion < 0x10400) {
LAB_003da647:
              if (pIVar11 == (Instruction *)0x0) {
                IVar7 = 0;
              }
              else {
                IVar7 = pIVar11->typeId;
              }
              IVar7 = createVariable(this,DecorationMax,Function,IVar7,"indexable",0,true);
              createStore(this,(this->accessChain).base,IVar7,MaskNone,Max,0);
            }
            else {
              bVar5 = isValidInitializer(this,uVar1);
              uVar1 = (this->accessChain).base;
              pIVar11 = (this->module).idToInstruction.
                        super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar1];
              if (!bVar5) goto LAB_003da647;
              if (pIVar11 == (Instruction *)0x0) {
                IVar7 = 0;
              }
              else {
                IVar7 = pIVar11->typeId;
              }
              IVar7 = createVariable(this,DecorationMax,Function,IVar7,"indexable",uVar1,true);
              addDecoration(this,IVar7,DecorationNonWritable,-1);
            }
            (this->accessChain).base = IVar7;
            (this->accessChain).isRValue = false;
            IVar7 = collapseAccessChain(this);
            IVar7 = createLoad(this,IVar7,precision,MaskNone,Max,0);
          }
          goto LAB_003da6f7;
        }
        local_4c = getConstantScalar(this,pIVar9[lVar13]);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&indexes,&local_4c);
        pIVar9 = (this->accessChain).indexChain.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pIVar10 = (this->accessChain).indexChain.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      IVar7 = createCompositeExtract(this,(this->accessChain).base,IVar7,&indexes);
      setPrecision(this,IVar7,precision);
LAB_003da6f7:
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    }
  }
  else {
    transferAccessChainSwizzle(this,true);
    SVar6 = getStorageClass(this,(this->accessChain).base);
    memoryAccess_00 = memoryAccess | Aligned;
    if (SVar6 != PhysicalStorageBuffer) {
      memoryAccess_00 = memoryAccess;
    }
    IVar7 = collapseAccessChain(this);
    addDecoration(this,IVar7,l_nonUniform,-1);
    IVar7 = createLoad(this,IVar7,precision,memoryAccess_00,scope,-alignment & alignment);
    addDecoration(this,IVar7,r_nonUniform,-1);
  }
  puVar3 = (this->accessChain).swizzle.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (this->accessChain).swizzle.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  IVar8 = (this->accessChain).component;
  if (puVar4 != puVar3 || IVar8 != 0) {
    if (puVar4 != puVar3) {
      pIVar11 = (this->module).idToInstruction.
                super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
                super__Vector_impl_data._M_start[IVar7];
      if (pIVar11 == (Instruction *)0x0) {
        IVar8 = 0;
      }
      else {
        IVar8 = pIVar11->typeId;
      }
      IVar8 = getScalarTypeId(this,IVar8);
      uVar12 = (long)(this->accessChain).swizzle.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->accessChain).swizzle.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2;
      if (1 < uVar12) {
        IVar8 = makeVectorType(this,IVar8,(int)uVar12);
      }
      IVar7 = createRvalueSwizzle(this,precision,IVar8,IVar7,&(this->accessChain).swizzle);
      IVar8 = (this->accessChain).component;
    }
    if (IVar8 != 0) {
      IVar7 = createVectorExtractDynamic(this,IVar7,resultType,IVar8);
      IVar7 = setPrecision(this,IVar7,precision);
    }
    addDecoration(this,IVar7,r_nonUniform,-1);
  }
  return IVar7;
}

Assistant:

Id Builder::accessChainLoad(Decoration precision, Decoration l_nonUniform,
    Decoration r_nonUniform, Id resultType, spv::MemoryAccessMask memoryAccess,
    spv::Scope scope, unsigned int alignment)
{
    Id id;

    if (accessChain.isRValue) {
        // transfer access chain, but try to stay in registers
        transferAccessChainSwizzle(false);
        if (accessChain.indexChain.size() > 0) {
            Id swizzleBase = accessChain.preSwizzleBaseType != NoType ? accessChain.preSwizzleBaseType : resultType;

            // if all the accesses are constants, we can use OpCompositeExtract
            std::vector<unsigned> indexes;
            bool constant = true;
            for (int i = 0; i < (int)accessChain.indexChain.size(); ++i) {
                if (isConstantScalar(accessChain.indexChain[i]))
                    indexes.push_back(getConstantScalar(accessChain.indexChain[i]));
                else {
                    constant = false;
                    break;
                }
            }

            if (constant) {
                id = createCompositeExtract(accessChain.base, swizzleBase, indexes);
                setPrecision(id, precision);
            } else if (isCooperativeVector(accessChain.base)) {
                assert(accessChain.indexChain.size() == 1);
                id = createVectorExtractDynamic(accessChain.base, resultType, accessChain.indexChain[0]);
            } else {
                Id lValue = NoResult;
                if (spvVersion >= Spv_1_4 && isValidInitializer(accessChain.base)) {
                    // make a new function variable for this r-value, using an initializer,
                    // and mark it as NonWritable so that downstream it can be detected as a lookup
                    // table
                    lValue = createVariable(NoPrecision, StorageClassFunction, getTypeId(accessChain.base),
                        "indexable", accessChain.base);
                    addDecoration(lValue, DecorationNonWritable);
                } else {
                    lValue = createVariable(NoPrecision, StorageClassFunction, getTypeId(accessChain.base),
                        "indexable");
                    // store into it
                    createStore(accessChain.base, lValue);
                }
                // move base to the new variable
                accessChain.base = lValue;
                accessChain.isRValue = false;

                // load through the access chain
                id = createLoad(collapseAccessChain(), precision);
            }
        } else
            id = accessChain.base;  // no precision, it was set when this was defined
    } else {
        transferAccessChainSwizzle(true);

        // take LSB of alignment
        alignment = alignment & ~(alignment & (alignment-1));
        if (getStorageClass(accessChain.base) == StorageClassPhysicalStorageBufferEXT) {
            memoryAccess = (spv::MemoryAccessMask)(memoryAccess | spv::MemoryAccessAlignedMask);
        }

        // load through the access chain
        id = collapseAccessChain();
        // Apply nonuniform both to the access chain and the loaded value.
        // Buffer accesses need the access chain decorated, and this is where
        // loaded image types get decorated. TODO: This should maybe move to
        // createImageTextureFunctionCall.
        addDecoration(id, l_nonUniform);
        id = createLoad(id, precision, memoryAccess, scope, alignment);
        addDecoration(id, r_nonUniform);
    }

    // Done, unless there are swizzles to do
    if (accessChain.swizzle.size() == 0 && accessChain.component == NoResult)
        return id;

    // Do remaining swizzling

    // Do the basic swizzle
    if (accessChain.swizzle.size() > 0) {
        Id swizzledType = getScalarTypeId(getTypeId(id));
        if (accessChain.swizzle.size() > 1)
            swizzledType = makeVectorType(swizzledType, (int)accessChain.swizzle.size());
        id = createRvalueSwizzle(precision, swizzledType, id, accessChain.swizzle);
    }

    // Do the dynamic component
    if (accessChain.component != NoResult)
        id = setPrecision(createVectorExtractDynamic(id, resultType, accessChain.component), precision);

    addDecoration(id, r_nonUniform);
    return id;
}